

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_points.cpp
# Opt level: O1

void __thiscall
Am_Drawonable_Impl::Draw_Lines
          (Am_Drawonable_Impl *this,Am_Style *ls,Am_Style *fs,Am_Point_Array *pts,Am_Draw_Function f
          )

{
  uint *puVar1;
  XPoint *ar;
  int iVar2;
  Am_Point_Array_Data *pAVar3;
  
  pAVar3 = pts->data;
  if (pAVar3 != (Am_Point_Array_Data *)0x0) {
    puVar1 = &(pAVar3->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 + 1;
    iVar2 = (**(pAVar3->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type)(pAVar3)
    ;
    if ((Am_ID_Tag)iVar2 == Am_Point_Array_Data::id) goto LAB_0027d26d;
  }
  pAVar3 = (Am_Point_Array_Data *)0x0;
LAB_0027d26d:
  if (pAVar3 != (Am_Point_Array_Data *)0x0) {
    ar = (pAVar3->points).super__Vector_base<XPoint,_std::allocator<XPoint>_>._M_impl.
         super__Vector_impl_data._M_start;
    poly_draw_it(this,ls,fs,f,ar,
                 (int)((ulong)((long)(pAVar3->points).
                                     super__Vector_base<XPoint,_std::allocator<XPoint>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)ar) >> 2));
    puVar1 = &(pAVar3->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      (*(pAVar3->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[4])(pAVar3);
      return;
    }
  }
  return;
}

Assistant:

void
Am_Drawonable_Impl::Draw_Lines(const Am_Style &ls, const Am_Style &fs,
                               const Am_Point_Array &pts, Am_Draw_Function f)
{
  Am_Point_Array_Data *data = Am_Point_Array_Data::Narrow(pts);

  if (data) {
    poly_draw_it(ls, fs, f, &data->points[0], (int)data->points.size());
    data->Release();
  }
}